

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expanddims.cpp
# Opt level: O2

int __thiscall ncnn::ExpandDims::load_param(ExpandDims *this,ParamDict *pd)

{
  int iVar1;
  Mat local_a0;
  Mat local_58;
  
  iVar1 = ParamDict::get(pd,0,0);
  this->expand_w = iVar1;
  iVar1 = ParamDict::get(pd,1,0);
  this->expand_h = iVar1;
  iVar1 = ParamDict::get(pd,2,0);
  this->expand_c = iVar1;
  local_58.cstep = 0;
  local_58.data = (void *)0x0;
  local_58.refcount._0_4_ = 0;
  local_58.refcount._4_4_ = 0;
  local_58.elemsize._0_4_ = 0;
  local_58._20_8_ = 0;
  local_58.allocator = (Allocator *)0x0;
  local_58.dims = 0;
  local_58.w = 0;
  local_58.h = 0;
  local_58.d = 0;
  local_58.c = 0;
  ParamDict::get(&local_a0,pd,3,&local_58);
  Mat::operator=(&this->axes,&local_a0);
  Mat::~Mat(&local_a0);
  Mat::~Mat(&local_58);
  return 0;
}

Assistant:

int ExpandDims::load_param(const ParamDict& pd)
{
    expand_w = pd.get(0, 0);
    expand_h = pd.get(1, 0);
    expand_c = pd.get(2, 0);
    axes = pd.get(3, Mat());

    return 0;
}